

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O1

int __thiscall xmrig::OclBaseRunner::init(OclBaseRunner *this,EVP_PKEY_CTX *ctx)

{
  cl_context context;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  cl_command_queue p_Var5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  OclSharedData *this_00;
  cl_mem p_Var6;
  long lVar7;
  ulong uVar8;
  size_t offset;
  ulong size;
  
  context = this->m_ctx;
  iVar4 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
  p_Var5 = OclLib::createCommandQueue
                     (context,*(cl_device_id *)(CONCAT44(extraout_var,iVar4) + 0x20));
  this->m_queue = p_Var5;
  iVar4 = (*(this->super_IOclRunner)._vptr_IOclRunner[0xe])(this);
  size = ((CONCAT44(extraout_var_00,iVar4) - 1U) / this->m_align + 1) * this->m_align;
  if (size < 0x40000000) {
    iVar4 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
    if (*(int *)(CONCAT44(extraout_var_01,iVar4) + 0x78) == 1) {
      iVar4 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
      uVar8 = *(ulong *)(CONCAT44(extraout_var_02,iVar4) + 0x60);
      uVar1 = *(ulong *)(CONCAT44(extraout_var_02,iVar4) + 0x68);
      if (uVar1 < uVar8) {
        uVar8 = uVar1;
      }
      if (0x3fffffff < uVar8) {
        (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
        this_00 = OclSharedState::get(0);
        p_Var6 = OclSharedData::createBuffer(this_00,this->m_ctx,size,&this->m_offset);
        goto LAB_00166496;
      }
    }
  }
  p_Var6 = OclLib::createBuffer(this->m_ctx,1,size,(void *)0x0);
LAB_00166496:
  this->m_buffer = p_Var6;
  p_Var6 = OclLib::createSubBuffer(p_Var6,0x84,this->m_offset,0x80);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->m_align;
  offset = (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar2,0) + 1) * this->m_align +
           this->m_offset;
  this->m_offset = offset;
  this->m_input = p_Var6;
  p_Var6 = OclLib::createSubBuffer(this->m_buffer,1,offset,0x400);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_align;
  lVar7 = (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3ff)) / auVar3,0) + 1) * this->m_align;
  this->m_offset = this->m_offset + lVar7;
  this->m_output = p_Var6;
  return (int)lVar7;
}

Assistant:

void xmrig::OclBaseRunner::init()
{
    m_queue = OclLib::createCommandQueue(m_ctx, data().device.id());

    size_t size = align(bufferSize());

    if (size < oneGiB && data().device.vendorId() == OCL_VENDOR_AMD && data().device.freeMemSize() >= oneGiB) {
        m_buffer = OclSharedState::get(data().device.index()).createBuffer(m_ctx, size, m_offset);
    }
    else {
        m_buffer = OclLib::createBuffer(m_ctx, CL_MEM_READ_WRITE, size);
    }

    m_input  = createSubBuffer(CL_MEM_READ_ONLY | CL_MEM_HOST_WRITE_ONLY, Job::kMaxBlobSize);
    m_output = createSubBuffer(CL_MEM_READ_WRITE, sizeof(cl_uint) * 0x100);
}